

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::setModel(Picker *this,QAbstractItemModel *model)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  int iVar3;
  Int IVar4;
  PickerPrivate *pPVar5;
  Picker *pPVar6;
  QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
  *this_00;
  ConnectionType type;
  QModelIndex local_300;
  QPersistentModelIndex local_2e8 [24];
  undefined1 local_2d0 [24];
  QPersistentModelIndex local_2b8 [24];
  QModelIndex local_2a0;
  QFlags<Qt::ItemFlag> local_288;
  Int local_284;
  int local_280;
  byte local_279;
  int pos;
  bool currentReset;
  undefined8 local_270;
  code *local_268;
  undefined8 local_260;
  Object local_258 [8];
  code *local_250;
  undefined8 uStack_248;
  code *local_240;
  undefined8 local_238;
  Object local_230 [8];
  code *local_228;
  undefined8 uStack_220;
  code *local_218;
  undefined8 local_210;
  Object local_208 [8];
  code *local_200;
  undefined8 uStack_1f8;
  code *local_1f0;
  undefined8 local_1e8;
  Object local_1e0 [8];
  code *local_1d8;
  undefined8 uStack_1d0;
  code *local_1c8;
  undefined8 local_1c0;
  Object local_1b8 [8];
  code *local_1b0;
  undefined8 uStack_1a8;
  code *local_1a0;
  undefined8 local_198;
  Object local_190 [8];
  code *local_188;
  undefined8 uStack_180;
  code *local_178;
  undefined8 local_170;
  Object local_168 [8];
  code *local_160;
  undefined8 uStack_158;
  code *local_150;
  undefined8 local_148;
  Object local_140 [8];
  code *local_138;
  undefined8 local_130;
  code *local_128;
  undefined8 local_120;
  code *local_118;
  undefined8 local_110;
  code *local_108;
  undefined8 local_100;
  code *local_f8;
  undefined8 local_f0;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 local_d0;
  code *local_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  QMessageLogger local_38;
  QAbstractItemModel *local_18;
  QAbstractItemModel *model_local;
  Picker *this_local;
  
  local_18 = model;
  model_local = (QAbstractItemModel *)this;
  if (model == (QAbstractItemModel *)0x0) {
    QMessageLogger::QMessageLogger(&local_38,(char *)0x0,0,(char *)0x0);
    QMessageLogger::warning((char *)&local_38,"QtMWidgets::Picker::setModel: cannot set a 0 model");
  }
  else {
    pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    if (pPVar5->model != (QAbstractItemModel *)0x0) {
      this_00 = &this->d;
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(this_00);
      local_48 = QAbstractItemModel::dataChanged;
      local_40 = 0;
      local_58 = _q_dataChanged;
      local_50 = 0;
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QtMWidgets::Picker::*)(QModelIndex_const&,QModelIndex_const&)>
                (pPVar5->model,(offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::dataChanged
                 ,(Object *)0x0,(Function)this);
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(this_00);
      local_68 = QAbstractItemModel::rowsAboutToBeInserted;
      local_60 = 0;
      local_78 = _q_updateIndexBeforeChange;
      local_70 = 0;
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
                (pPVar5->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsAboutToBeInserted,
                 (Object *)0x0,(Function)this);
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(this_00);
      local_88 = QAbstractItemModel::rowsInserted;
      local_80 = 0;
      local_98 = _q_rowsInserted;
      local_90 = 0;
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)(QModelIndex_const&,int,int)>
                (pPVar5->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsInserted,
                 (Object *)0x0,(Function)this);
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(this_00);
      local_a8 = QAbstractItemModel::rowsAboutToBeRemoved;
      local_a0 = 0;
      local_b8 = _q_updateIndexBeforeChange;
      local_b0 = 0;
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
                (pPVar5->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsAboutToBeRemoved,
                 (Object *)0x0,(Function)this);
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(this_00);
      local_c8 = QAbstractItemModel::rowsRemoved;
      local_c0 = 0;
      local_d8 = _q_rowsRemoved;
      local_d0 = 0;
      QObject::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)(QModelIndex_const&,int,int)>
                (pPVar5->model,(offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsRemoved
                 ,(Object *)0x0,(Function)this);
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(this_00);
      local_e8 = QObject::destroyed;
      local_e0 = 0;
      local_f8 = _q_modelDestroyed;
      local_f0 = 0;
      QObject::disconnect<void(QObject::*)(QObject*),void(QtMWidgets::Picker::*)()>
                ((Object *)pPVar5->model,(offset_in_QObject_to_subr)QObject::destroyed,(Object *)0x0
                 ,(Function)this);
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(this_00);
      local_108 = QAbstractItemModel::modelAboutToBeReset;
      local_100 = 0;
      local_118 = _q_updateIndexBeforeChange;
      local_110 = 0;
      QObject::
      disconnect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
                (pPVar5->model,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::modelAboutToBeReset,
                 (Object *)0x0,(Function)this);
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(this_00);
      local_128 = QAbstractItemModel::modelReset;
      local_120 = 0;
      local_138 = _q_modelReset;
      local_130 = 0;
      QObject::
      disconnect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
                (pPVar5->model,(offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::modelReset,
                 (Object *)0x0,(Function)this);
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      pPVar6 = (Picker *)QObject::parent((QObject *)pPVar5->model);
      if (pPVar6 == this) {
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        if (pPVar5->model != (QAbstractItemModel *)0x0) {
          (**(code **)(*(long *)pPVar5->model + 0x20))();
        }
      }
    }
    pQVar1 = local_18;
    pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar5->model = pQVar1;
    local_150 = QAbstractItemModel::dataChanged;
    local_148 = 0;
    local_160 = _q_dataChanged;
    uStack_158 = 0;
    type = (ConnectionType)this;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QtMWidgets::Picker::*)(QModelIndex_const&,QModelIndex_const&)>
              (local_140,(offset_in_QAbstractItemModel_to_subr)local_18,
               (Object *)QAbstractItemModel::dataChanged,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_140);
    local_178 = QAbstractItemModel::rowsAboutToBeInserted;
    local_170 = 0;
    local_188 = _q_updateIndexBeforeChange;
    uStack_180 = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
              (local_168,(offset_in_QAbstractItemModel_to_subr)local_18,
               (Object *)QAbstractItemModel::rowsAboutToBeInserted,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_168);
    local_1a0 = QAbstractItemModel::rowsInserted;
    local_198 = 0;
    local_1b0 = _q_rowsInserted;
    uStack_1a8 = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)(QModelIndex_const&,int,int)>
              (local_190,(offset_in_QAbstractItemModel_to_subr)local_18,
               (Object *)QAbstractItemModel::rowsInserted,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_190);
    local_1c8 = QAbstractItemModel::rowsAboutToBeRemoved;
    local_1c0 = 0;
    local_1d8 = _q_updateIndexBeforeChange;
    uStack_1d0 = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
              (local_1b8,(offset_in_QAbstractItemModel_to_subr)local_18,
               (Object *)QAbstractItemModel::rowsAboutToBeRemoved,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_1b8);
    local_1f0 = QAbstractItemModel::rowsRemoved;
    local_1e8 = 0;
    local_200 = _q_rowsRemoved;
    uStack_1f8 = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)(QModelIndex_const&,int,int)>
              (local_1e0,(offset_in_QAbstractItemModel_to_subr)local_18,
               (Object *)QAbstractItemModel::rowsRemoved,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_1e0);
    local_218 = QObject::destroyed;
    local_210 = 0;
    local_228 = _q_modelDestroyed;
    uStack_220 = 0;
    QObject::connect<void(QObject::*)(QObject*),void(QtMWidgets::Picker::*)()>
              (local_208,(offset_in_QObject_to_subr)local_18,(Object *)QObject::destroyed,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_208);
    local_240 = QAbstractItemModel::modelAboutToBeReset;
    local_238 = 0;
    local_250 = _q_updateIndexBeforeChange;
    uStack_248 = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
              (local_230,(offset_in_QAbstractItemModel_to_subr)local_18,
               (Object *)QAbstractItemModel::modelAboutToBeReset,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_230);
    local_268 = QAbstractItemModel::modelReset;
    local_260 = 0;
    _pos = _q_modelReset;
    local_270 = 0;
    QObject::
    connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QtMWidgets::Picker::*)()>
              (local_258,(offset_in_QAbstractItemModel_to_subr)local_18,
               (Object *)QAbstractItemModel::modelReset,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_258);
    local_279 = 0;
    iVar2 = count(this);
    if (iVar2 != 0) {
      for (local_280 = 0; iVar2 = local_280, iVar3 = count(this), iVar2 < iVar3;
          local_280 = local_280 + 1) {
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        iVar3 = local_280;
        pQVar1 = pPVar5->model;
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        iVar2 = pPVar5->modelColumn;
        QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
        ::operator->(&this->d);
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_2b8);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_2a0,pQVar1,iVar3,iVar2,local_2b8);
        local_288.i = (Int)QModelIndex::flags(&local_2a0);
        local_284 = (Int)QFlags<Qt::ItemFlag>::operator&(&local_288,ItemIsEnabled);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_284);
        if (IVar4 != 0) {
          pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                   ::operator->(&this->d);
          iVar3 = local_280;
          pQVar1 = pPVar5->model;
          pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                   ::operator->(&this->d);
          iVar2 = pPVar5->modelColumn;
          QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
          ::operator->(&this->d);
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_2e8);
          (**(code **)(*(long *)pQVar1 + 0x60))(local_2d0,pQVar1,iVar3,iVar2,local_2e8);
          pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                   ::operator->(&this->d);
          QPersistentModelIndex::operator=(&pPVar5->topItemIndex,(QModelIndex *)local_2d0);
          setCurrentIndex(this,local_280);
          local_279 = 1;
          break;
        }
      }
    }
    if ((local_279 & 1) == 0) {
      setCurrentIndex(this,-1);
      QModelIndex::QModelIndex(&local_300);
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      QPersistentModelIndex::operator=(&pPVar5->topItemIndex,(QModelIndex *)&local_300);
    }
  }
  return;
}

Assistant:

void
Picker::setModel( QAbstractItemModel * model )
{
	if( !model )
	{
		qWarning( "QtMWidgets::Picker::setModel: cannot set a 0 model" );
		return;
	}

	if( d->model )
	{
		disconnect( d->model, &QAbstractItemModel::dataChanged,
			this, &Picker::_q_dataChanged );
		disconnect( d->model, &QAbstractItemModel::rowsAboutToBeInserted,
			this, &Picker::_q_updateIndexBeforeChange );
		disconnect( d->model, &QAbstractItemModel::rowsInserted,
			this, &Picker::_q_rowsInserted );
		disconnect( d->model, &QAbstractItemModel::rowsAboutToBeRemoved,
			this, &Picker::_q_updateIndexBeforeChange );
		disconnect( d->model, &QAbstractItemModel::rowsRemoved,
			this, &Picker::_q_rowsRemoved );
		disconnect( d->model, &QAbstractItemModel::destroyed,
			this, &Picker::_q_modelDestroyed );
		disconnect( d->model, &QAbstractItemModel::modelAboutToBeReset,
			this, &Picker::_q_updateIndexBeforeChange );
		disconnect( d->model, &QAbstractItemModel::modelReset,
			this, &Picker::_q_modelReset );

		if( d->model->QObject::parent() == this )
			delete d->model;
	}

	d->model = model;

	connect( model, &QAbstractItemModel::dataChanged,
		this, &Picker::_q_dataChanged );
	connect( model, &QAbstractItemModel::rowsAboutToBeInserted,
		this, &Picker::_q_updateIndexBeforeChange );
	connect( model, &QAbstractItemModel::rowsInserted,
		this, &Picker::_q_rowsInserted );
	connect( model, &QAbstractItemModel::rowsAboutToBeRemoved,
		this, &Picker::_q_updateIndexBeforeChange );
	connect( model, &QAbstractItemModel::rowsRemoved,
		this, &Picker::_q_rowsRemoved );
	connect( model, &QAbstractItemModel::destroyed,
		this, &Picker::_q_modelDestroyed );
	connect( model, &QAbstractItemModel::modelAboutToBeReset,
		this, &Picker::_q_updateIndexBeforeChange );
	connect( model, &QAbstractItemModel::modelReset,
		this, &Picker::_q_modelReset );

	bool currentReset = false;

	if( count() )
	{
		for( int pos = 0; pos < count(); ++pos )
		{
			if( d->model->index( pos, d->modelColumn, d->root ).flags() & Qt::ItemIsEnabled )
			{
				d->topItemIndex = d->model->index( pos, d->modelColumn, d->root );
				setCurrentIndex( pos );
				currentReset = true;
				break;
			}
		}
	}

	if( !currentReset )
	{
		setCurrentIndex( -1 );
		d->topItemIndex = QModelIndex();
	}
}